

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O2

Abc_Ntk_t * Io_Read(char *pFileName,Io_FileType_t FileType,int fCheck,int fBarBufs)

{
  Io_FileType_t IVar1;
  Abc_Ntk_t *pAVar2;
  Vec_Ptr_t *tempLtlStore;
  Abc_Ntk_t *pAVar3;
  char *__ptr;
  size_t sStack_30;
  
  pAVar2 = Io_ReadNetlist(pFileName,FileType,fCheck);
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  tempLtlStore = temporaryLtlStore(pAVar2);
  if (pAVar2->ntkType != ABC_NTK_NETLIST) {
    return pAVar2;
  }
  if (fBarBufs != 0) {
    pAVar3 = Abc_NtkToBarBufs(pAVar2);
    Abc_NtkDelete(pAVar2);
    if (pAVar3->ntkType != ABC_NTK_LOGIC) {
      __assert_fail("Abc_NtkIsLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioUtil.c"
                    ,0xfe,"Abc_Ntk_t *Io_Read(char *, Io_FileType_t, int, int)");
    }
    return pAVar3;
  }
  pAVar3 = pAVar2;
  if (0 < pAVar2->nObjCounts[9]) {
    pAVar3 = Abc_NtkFlattenLogicHierarchy(pAVar2);
    Abc_NtkDelete(pAVar2);
    if (pAVar3 == (Abc_Ntk_t *)0x0) {
      __ptr = "Flattening logic hierarchy has failed.\n";
      sStack_30 = 0x27;
      goto LAB_0029bb62;
    }
  }
  pAVar2 = pAVar3;
  if (0 < pAVar3->nObjCounts[10]) {
    printf("Hierarchy reader converted %d instances of blackboxes.\n");
    pAVar2 = Abc_NtkConvertBlackboxes(pAVar3);
    Abc_NtkDelete(pAVar3);
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      __ptr = "Converting blackboxes has failed.\n";
      sStack_30 = 0x22;
      goto LAB_0029bb62;
    }
  }
  IVar1 = Io_ReadFileType(pFileName);
  if (IVar1 == IO_FILE_BLIFMV) {
    pAVar3 = Abc_NtkStrashBlifMv(pAVar2);
    Abc_NtkDelete(pAVar2);
    if (pAVar3 != (Abc_Ntk_t *)0x0) {
      return pAVar3;
    }
    __ptr = "Converting BLIF-MV to AIG has failed.\n";
    sStack_30 = 0x26;
  }
  else {
    pAVar3 = Abc_NtkToLogic(pAVar2);
    if (tempLtlStore != (Vec_Ptr_t *)0x0) {
      updateLtlStoreOfNtk(pAVar3,tempLtlStore);
    }
    Abc_NtkDelete(pAVar2);
    if (pAVar3 != (Abc_Ntk_t *)0x0) {
      return pAVar3;
    }
    __ptr = "Converting netlist to logic network after reading has failed.\n";
    sStack_30 = 0x3e;
  }
LAB_0029bb62:
  fwrite(__ptr,sStack_30,1,_stdout);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_Read( char * pFileName, Io_FileType_t FileType, int fCheck, int fBarBufs )
{
    Abc_Ntk_t * pNtk, * pTemp;
	Vec_Ptr_t * vLtl;
    // get the netlist
    pNtk = Io_ReadNetlist( pFileName, FileType, fCheck );
    if ( pNtk == NULL )
        return NULL;
	vLtl = temporaryLtlStore( pNtk );
    if ( !Abc_NtkIsNetlist(pNtk) )
        return pNtk;
    // derive barbufs
    if ( fBarBufs )
    {
        pNtk = Abc_NtkToBarBufs( pTemp = pNtk );
        Abc_NtkDelete( pTemp );
        assert( Abc_NtkIsLogic(pNtk) );
        return pNtk;
    }
    // flatten logic hierarchy
    assert( Abc_NtkIsNetlist(pNtk) );
    if ( Abc_NtkWhiteboxNum(pNtk) > 0 )
    {
        pNtk = Abc_NtkFlattenLogicHierarchy( pTemp = pNtk );
        Abc_NtkDelete( pTemp );
        if ( pNtk == NULL )
        {
            fprintf( stdout, "Flattening logic hierarchy has failed.\n" );
            return NULL;
        }
    }
    // convert blackboxes
    if ( Abc_NtkBlackboxNum(pNtk) > 0 )
    {
        printf( "Hierarchy reader converted %d instances of blackboxes.\n", Abc_NtkBlackboxNum(pNtk) );
        pNtk = Abc_NtkConvertBlackboxes( pTemp = pNtk );
        Abc_NtkDelete( pTemp );
        if ( pNtk == NULL )
        {
            fprintf( stdout, "Converting blackboxes has failed.\n" );
            return NULL;
        }
    }
    // consider the case of BLIF-MV
    if ( Io_ReadFileType(pFileName) == IO_FILE_BLIFMV )
    {
        pNtk = Abc_NtkStrashBlifMv( pTemp = pNtk );
        Abc_NtkDelete( pTemp );
        if ( pNtk == NULL )
        {
            fprintf( stdout, "Converting BLIF-MV to AIG has failed.\n" );
            return NULL;
        }
        return pNtk;
    }
    // convert the netlist into the logic network
    pNtk = Abc_NtkToLogic( pTemp = pNtk );
	if( vLtl )
		updateLtlStoreOfNtk( pNtk, vLtl );
    Abc_NtkDelete( pTemp );
    if ( pNtk == NULL )
    {
        fprintf( stdout, "Converting netlist to logic network after reading has failed.\n" );
        return NULL;
    }
    return pNtk;
}